

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void __thiscall CVmTimeZoneCache::~CVmTimeZoneCache(CVmTimeZoneCache *this)

{
  void *pvVar1;
  long in_RDI;
  CVmHashTable *in_stack_ffffffffffffffc0;
  CVmTimeZone *in_stack_ffffffffffffffd0;
  
  if ((*(long *)(in_RDI + 0x18) != 0) && (pvVar1 = *(void **)(in_RDI + 0x18), pvVar1 != (void *)0x0)
     ) {
    CVmHashTable::~CVmHashTable(in_stack_ffffffffffffffc0);
    operator_delete(pvVar1,0x20);
  }
  if ((*(long *)(in_RDI + 0x20) != 0) && (pvVar1 = *(void **)(in_RDI + 0x20), pvVar1 != (void *)0x0)
     ) {
    CVmHashTable::~CVmHashTable(in_stack_ffffffffffffffc0);
    operator_delete(pvVar1,0x20);
  }
  if ((*(long *)(in_RDI + 0x28) != 0) && (pvVar1 = *(void **)(in_RDI + 0x28), pvVar1 != (void *)0x0)
     ) {
    CVmHashTable::~CVmHashTable(in_stack_ffffffffffffffc0);
    operator_delete(pvVar1,0x20);
  }
  if ((*(long *)(in_RDI + 8) != 0) &&
     (in_stack_ffffffffffffffd0 = *(CVmTimeZone **)(in_RDI + 8),
     in_stack_ffffffffffffffd0 != (CVmTimeZone *)0x0)) {
    operator_delete__(in_stack_ffffffffffffffd0);
  }
  if ((*(long *)(in_RDI + 0x10) != 0) && (pvVar1 = *(void **)(in_RDI + 0x10), pvVar1 != (void *)0x0)
     ) {
    CVmTimeZone::~CVmTimeZone(in_stack_ffffffffffffffd0);
    operator_delete(pvVar1,0x68);
  }
  if ((*(long *)(in_RDI + 0x38) != 0) && (*(void **)(in_RDI + 0x38) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x38));
  }
  if ((*(long *)(in_RDI + 0x40) != 0) && (*(void **)(in_RDI + 0x40) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x40));
  }
  if ((*(long *)(in_RDI + 0x48) != 0) && (*(void **)(in_RDI + 0x48) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x48));
  }
  return;
}

Assistant:

CVmTimeZoneCache::~CVmTimeZoneCache()
{
    /* delete our zone table, zone index, and abbreviation table */
    if (db_tab_ != 0)
        delete db_tab_;
    if (synth_tab_ != 0)
        delete synth_tab_;
    if (abbr_tab_ != 0)
        delete abbr_tab_;

    /* delete the local zone name, if set */
    if (local_zone_name_ != 0)
        delete [] local_zone_name_;

    /* if we have a local zone object, delete it */
    if (local_zone_ != 0)
        delete local_zone_;

    /* if we loaded the file data sections, delete them */
    if (zone_bytes_ != 0)
        delete [] zone_bytes_;
    if (link_bytes_ != 0)
        delete [] link_bytes_;
    if (abbr_bytes_ != 0)
        delete [] abbr_bytes_;
}